

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_That_Test::Body
          (iu_SyntaxTest_x_iutest_x_That_Test *this)

{
  Fixed *pFVar1;
  int iVar2;
  AssertionResult *in_R8;
  int x;
  AssertionResult iutest_ar;
  string local_210;
  string local_1f0;
  iuCodeMessage local_1d0;
  undefined1 local_1a0 [392];
  
  iVar2 = 1;
  local_1a0._0_8_ = &PTR__IMatcher_0039f6f8;
  x = iVar2;
  local_1d0.m_message._M_dataplus._M_p._0_4_ = iVar2;
  local_1a0._8_8_ = &local_1d0;
  iutest::detail::EqMatcher<int>::operator()(&iutest_ar,(EqMatcher<int> *)local_1a0,&x);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<((Fixed *)local_1a0,x);
    iutest::PrintToString<int>(&local_210,&x);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_1f0,(detail *)local_210._M_dataplus._M_p,"::iutest::Eq(1)",(char *)&iutest_ar,
               in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x273,local_1f0._M_dataplus._M_p);
    local_1d0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,pFVar1);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    local_1a0._0_8_ = &PTR__IMatcher_0039f738;
    x = iVar2;
    local_1d0.m_message._M_dataplus._M_p._0_4_ = iVar2;
    local_1a0._8_8_ = &local_1d0;
    iutest::detail::LeMatcher<int>::operator()(&iutest_ar,(LeMatcher<int> *)local_1a0,&x);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<((Fixed *)local_1a0,x);
      iutest::PrintToString<int>(&local_210,&x);
      iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
                (&local_1f0,(detail *)local_210._M_dataplus._M_p,"::iutest::Le(1)",
                 (char *)&iutest_ar,in_R8);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x275,local_1f0._M_dataplus._M_p);
      local_1d0._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,pFVar1);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    local_1a0._0_8_ = &PTR__IMatcher_0039f778;
    x = iVar2;
    local_1d0.m_message._M_dataplus._M_p._0_4_ = iVar2;
    local_1a0._8_8_ = &local_1d0;
    iutest::detail::GeMatcher<int>::operator()(&iutest_ar,(GeMatcher<int> *)local_1a0,&x);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<((Fixed *)local_1a0,x);
      iutest::PrintToString<int>(&local_210,&x);
      iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
                (&local_1f0,(detail *)local_210._M_dataplus._M_p,"::iutest::Ge(1)",
                 (char *)&iutest_ar,in_R8);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x277,local_1f0._M_dataplus._M_p);
      local_1d0._44_4_ = 0xffffffff;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,pFVar1);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    x = 1;
    local_1d0.m_message._M_dataplus._M_p._0_4_ = 0;
    local_1a0._0_8_ = &PTR__IMatcher_0039f7b8;
    local_1a0._8_8_ = &local_1d0;
    iutest::detail::NeMatcher<int>::operator()(&iutest_ar,(NeMatcher<int> *)local_1a0,&x);
    if (iutest_ar.m_result != false) goto LAB_002e55ca;
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<((Fixed *)local_1a0,x);
    iutest::PrintToString<int>(&local_210,&x);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_1f0,(detail *)local_210._M_dataplus._M_p,"::iutest::Ne(0)",(char *)&iutest_ar,
               in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x279,local_1f0._M_dataplus._M_p);
    local_1d0._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,pFVar1);
  }
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
LAB_002e55ca:
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(SyntaxTest, That)
{
    if( int x=1 )
        IUTEST_ASSERT_THAT(x, ::iutest::Eq(1)) << x;
    if( int x=1 )
        IUTEST_EXPECT_THAT(x, ::iutest::Le(1)) << x;
    if( int x=1 )
        IUTEST_INFORM_THAT(x, ::iutest::Ge(1)) << x;
    if( int x=1 )
        IUTEST_ASSUME_THAT(x, ::iutest::Ne(0)) << x;
}